

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O1

int ecx_SDOwrite(ecx_contextt *context,uint16 Slave,uint16 Index,uint8 SubIndex,boolean CA,int psize
                ,void *p,int Timeout)

{
  ec_slavet *peVar1;
  bool bVar2;
  uint8 uVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  undefined6 in_register_00000032;
  uint uVar11;
  undefined7 in_register_00000081;
  byte bVar12;
  void *__src;
  ec_mbxbuft MbxIn;
  ec_mbxbuft MbxOut;
  uint local_878;
  uint8 local_838 [5];
  byte local_833;
  ushort local_832;
  byte local_830;
  uint16 local_82f;
  uint8 local_82d;
  uint local_438;
  uint8 local_434;
  byte local_433;
  uint8 local_432 [2];
  byte local_430;
  uint16 local_42f;
  uint8 local_42d;
  int local_42c;
  undefined1 local_428 [1016];
  
  ec_clearmbx((ec_mbxbuft *)local_838);
  ecx_mbxreceive(context,Slave,(ec_mbxbuft *)local_838,0);
  ec_clearmbx((ec_mbxbuft *)&local_438);
  peVar1 = context->slavelist;
  uVar8 = CONCAT62(in_register_00000032,Slave) & 0xffffffff;
  local_42f = Index;
  if ((int)CONCAT71(in_register_00000081,CA) == 0 && psize < 5) {
    local_438 = 10;
    local_434 = '\0';
    uVar3 = ec_nextmbxcnt(peVar1[uVar8].mbx_cnt);
    context->slavelist[uVar8].mbx_cnt = uVar3;
    local_433 = uVar3 << 4 | 3;
    local_432[0] = '\0';
    local_432[1] = ' ';
    local_430 = (-(char)psize & 3U) << 2 | 0x23;
    local_42d = SubIndex;
    memcpy(&local_42c,p,(long)psize);
    iVar5 = ecx_mbxsend(context,Slave,(ec_mbxbuft *)&local_438,20000);
    if (iVar5 < 1) {
      return iVar5;
    }
    ec_clearmbx((ec_mbxbuft *)local_838);
    iVar5 = ecx_mbxreceive(context,Slave,(ec_mbxbuft *)local_838,Timeout);
    if (iVar5 < 1) {
      return iVar5;
    }
    if (((((local_833 & 0xf) == 3) && ((local_832 & 0xf000) == 0x3000)) && (local_82f == local_42f))
       && (local_82d == local_42d)) {
      return iVar5;
    }
  }
  else {
    uVar4 = peVar1[uVar8].mbx_l;
    uVar9 = uVar4 - 0x10;
    local_878 = psize & 0xffff;
    uVar6 = psize;
    if ((int)uVar9 < (int)(psize & 0xffffU)) {
      uVar6 = uVar9;
    }
    uVar10 = uVar6 & 0xffff;
    local_438 = (uint)(ushort)((short)uVar6 + 10);
    local_434 = '\0';
    uVar3 = ec_nextmbxcnt(peVar1[uVar8].mbx_cnt);
    context->slavelist[uVar8].mbx_cnt = uVar3;
    local_433 = uVar3 << 4 | 3;
    local_432[0] = '\0';
    local_432[1] = ' ';
    local_42d = SubIndex != '\0';
    if (CA == '\0') {
      local_42d = SubIndex;
    }
    local_430 = (CA != '\0') << 4 | 0x21;
    local_42c = psize;
    memcpy(local_428,p,(ulong)uVar10);
    iVar5 = ecx_mbxsend(context,Slave,(ec_mbxbuft *)&local_438,20000);
    if (iVar5 < 1) {
      return iVar5;
    }
    ec_clearmbx((ec_mbxbuft *)local_838);
    iVar5 = ecx_mbxreceive(context,Slave,(ec_mbxbuft *)local_838,Timeout);
    if (iVar5 < 1) {
      return iVar5;
    }
    if ((((local_833 & 0xf) == 3) && ((local_832 & 0xf000) == 0x3000)) &&
       ((local_82f == local_42f && (local_82d == local_42d)))) {
      if ((int)local_878 <= (int)uVar9) {
        return iVar5;
      }
      __src = (void *)((long)p + (ulong)uVar10);
      uVar10 = psize - uVar10;
      uVar6 = uVar4 - 9;
      bVar12 = 0;
      do {
        uVar7 = uVar10 & 0xffff;
        uVar9 = uVar6;
        if ((int)uVar7 <= (int)uVar6) {
          uVar9 = uVar10;
        }
        uVar11 = uVar9 & 0xffff;
        bVar2 = (int)uVar6 < (int)uVar7;
        local_430 = (int)uVar7 <= (int)uVar6;
        if (((int)uVar6 < (int)uVar7) || (6 < uVar11)) {
          uVar4 = (short)uVar9 + 3;
        }
        else {
          uVar4 = 10;
          local_430 = (char)uVar9 * -2 + '\x0f';
        }
        local_438 = (uint)uVar4;
        local_434 = '\0';
        uVar3 = ec_nextmbxcnt(context->slavelist[uVar8].mbx_cnt);
        context->slavelist[uVar8].mbx_cnt = uVar3;
        local_433 = uVar3 << 4 | 3;
        local_432[0] = '\0';
        local_432[1] = ' ';
        local_430 = local_430 + bVar12;
        memcpy(&local_42f,__src,(ulong)uVar11);
        iVar5 = ecx_mbxsend(context,Slave,(ec_mbxbuft *)&local_438,20000);
        if (0 < iVar5) {
          ec_clearmbx((ec_mbxbuft *)local_838);
          iVar5 = ecx_mbxreceive(context,Slave,(ec_mbxbuft *)local_838,Timeout);
          if ((0 < iVar5) &&
             ((((local_833 & 0xf) != 3 || ((local_832 & 0xf000) != 0x3000)) ||
              ((local_830 & 0xe0) != 0x20)))) {
            ecx_packeterror(context,Slave,Index,SubIndex,1);
            iVar5 = 0;
            bVar2 = false;
          }
        }
        __src = (void *)((long)__src + (ulong)uVar11);
        uVar10 = uVar10 - uVar11;
        bVar12 = bVar12 ^ 0x10;
      } while (bVar2);
      return iVar5;
    }
  }
  ecx_packeterror(context,Slave,Index,SubIndex,1);
  return 0;
}

Assistant:

int ecx_SDOwrite(ecx_contextt *context, uint16 Slave, uint16 Index, uint8 SubIndex,
                boolean CA, int psize, void *p, int Timeout)
{
   ec_SDOt *SDOp, *aSDOp;
   int wkc, maxdata;
   ec_mbxbuft MbxIn, MbxOut;
   uint8 cnt, toggle;
   uint16 framedatasize;
   boolean  NotLast;
   uint8 *hp;

   ec_clearmbx(&MbxIn);
   /* Empty slave out mailbox if something is in. Timout set to 0 */
   wkc = ecx_mbxreceive(context, Slave, (ec_mbxbuft *)&MbxIn, 0);
   ec_clearmbx(&MbxOut);
   aSDOp = (ec_SDOt *)&MbxIn;
   SDOp = (ec_SDOt *)&MbxOut;
   maxdata = context->slavelist[Slave].mbx_l - 0x10; /* data section=mailbox size - 6 mbx - 2 CoE - 8 sdo req */
   /* if small data use expedited transfer */
   if ((psize <= 4) && !CA)
   {
      SDOp->MbxHeader.length = htoes(0x000a);
      SDOp->MbxHeader.address = htoes(0x0000);
      SDOp->MbxHeader.priority = 0x00;
      /* get new mailbox counter, used for session handle */
      cnt = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
      context->slavelist[Slave].mbx_cnt = cnt;
      SDOp->MbxHeader.mbxtype = ECT_MBXT_COE + (cnt << 4); /* CoE */
      SDOp->CANOpen = htoes(0x000 + (ECT_COES_SDOREQ << 12)); /* number 9bits service upper 4 bits */
      SDOp->Command = ECT_SDO_DOWN_EXP | (((4 - psize) << 2) & 0x0c); /* expedited SDO download transfer */
      SDOp->Index = htoes(Index);
      SDOp->SubIndex = SubIndex;
      hp = p;
      /* copy parameter data to mailbox */
      memcpy(&SDOp->ldata[0], hp, psize);
      /* send mailbox SDO download request to slave */
      wkc = ecx_mbxsend(context, Slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
      if (wkc > 0)
      {
         ec_clearmbx(&MbxIn);
         /* read slave response */
         wkc = ecx_mbxreceive(context, Slave, (ec_mbxbuft *)&MbxIn, Timeout);
         if (wkc > 0)
         {
            /* response should be CoE, SDO response, correct index and subindex */
            if (((aSDOp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_COE) && 
                ((etohs(aSDOp->CANOpen) >> 12) == ECT_COES_SDORES) &&
                 (aSDOp->Index == SDOp->Index) &&
                 (aSDOp->SubIndex == SDOp->SubIndex))
            {
                 /* all OK */
            }
            /* unexpected response from slave */
            else
            {
               if (aSDOp->Command == ECT_SDO_ABORT) /* SDO abort frame received */
               {
                  ecx_SDOerror(context, Slave, Index, SubIndex, etohl(aSDOp->ldata[0]));
               }
               else
               {
                  ecx_packeterror(context, Slave, Index, SubIndex, 1); /* Unexpected frame returned */
               }
               wkc = 0;
            }
         }
      }
   }
   else
   {
      framedatasize = psize;
      NotLast = FALSE;
      if (framedatasize > maxdata)
      {
         framedatasize = maxdata;  /*  segmented transfer needed  */
         NotLast = TRUE;
      }
      SDOp->MbxHeader.length = htoes(0x0a + framedatasize);
      SDOp->MbxHeader.address = htoes(0x0000);
      SDOp->MbxHeader.priority = 0x00;
      /* get new mailbox counter, used for session handle */
      cnt = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
      context->slavelist[Slave].mbx_cnt = cnt;
      SDOp->MbxHeader.mbxtype = ECT_MBXT_COE + (cnt << 4); /* CoE */
      SDOp->CANOpen = htoes(0x000 + (ECT_COES_SDOREQ << 12)); /* number 9bits service upper 4 bits */
      if (CA)
      {
         SDOp->Command = ECT_SDO_DOWN_INIT_CA; /* Complete Access, normal SDO init download transfer */
      }
      else
      {
         SDOp->Command = ECT_SDO_DOWN_INIT; /* normal SDO init download transfer */
      }
      SDOp->Index = htoes(Index);
      SDOp->SubIndex = SubIndex;
      if (CA && (SubIndex > 1))
      {
         SDOp->SubIndex = 1;
      }
      SDOp->ldata[0] = htoel(psize);
      hp = p;
      /* copy parameter data to mailbox */
      memcpy(&SDOp->ldata[1], hp, framedatasize);
      hp += framedatasize;
      psize -= framedatasize;
      /* send mailbox SDO download request to slave */
      wkc = ecx_mbxsend(context, Slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
      if (wkc > 0)
      {
         ec_clearmbx(&MbxIn);
         /* read slave response */
         wkc = ecx_mbxreceive(context, Slave, (ec_mbxbuft *)&MbxIn, Timeout);
         if (wkc > 0)
         {
            /* response should be CoE, SDO response, correct index and subindex */
            if (((aSDOp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_COE) && 
                ((etohs(aSDOp->CANOpen) >> 12) == ECT_COES_SDORES) &&
                 (aSDOp->Index == SDOp->Index) &&
                 (aSDOp->SubIndex == SDOp->SubIndex))
            {
               /* all ok */
               maxdata += 7;
               toggle = 0;
               /* repeat while segments left */
               while (NotLast)
               {
                  SDOp = (ec_SDOt *)&MbxOut;
                  framedatasize = psize;
                  NotLast = FALSE;
                  SDOp->Command = 0x01; /* last segment */
                  if (framedatasize > maxdata)
                  {
                     framedatasize = maxdata;  /*  more segments needed  */
                     NotLast = TRUE;
                     SDOp->Command = 0x00; /* segments follow */
                  }
                  if (!NotLast && (framedatasize < 7))
                  {
                     SDOp->MbxHeader.length = htoes(0x0a); /* minimum size */
                     SDOp->Command = 0x01 + ((7 - framedatasize) << 1); /* last segment reduced octets */
                  }
                  else
                  {
                     SDOp->MbxHeader.length = htoes(framedatasize + 3); /* data + 2 CoE + 1 SDO */
                  }
                  SDOp->MbxHeader.address = htoes(0x0000);
                  SDOp->MbxHeader.priority = 0x00;
                  /* get new mailbox counter value */
                  cnt = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
                  context->slavelist[Slave].mbx_cnt = cnt;
                  SDOp->MbxHeader.mbxtype = ECT_MBXT_COE + (cnt << 4); /* CoE */
                  SDOp->CANOpen = htoes(0x000 + (ECT_COES_SDOREQ << 12)); /* number 9bits service upper 4 bits (SDO request) */
                  SDOp->Command = SDOp->Command + toggle; /* add toggle bit to command byte */
                  /* copy parameter data to mailbox */
                  memcpy(&SDOp->Index, hp, framedatasize);
                  /* update parameter buffer pointer */
                  hp += framedatasize;
                  psize -= framedatasize;
                  /* send SDO download request */
                  wkc = ecx_mbxsend(context, Slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
                  if (wkc > 0)
                  {
                     ec_clearmbx(&MbxIn);
                     /* read slave response */
                     wkc = ecx_mbxreceive(context, Slave, (ec_mbxbuft *)&MbxIn, Timeout);
                     if (wkc > 0)
                     {
                        if (((aSDOp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_COE) &&
                            ((etohs(aSDOp->CANOpen) >> 12) == ECT_COES_SDORES) &&
                            ((aSDOp->Command & 0xe0) == 0x20))
                        {
                                   /* all OK, nothing to do */
                        }
                        else
                        {
                           if (aSDOp->Command == ECT_SDO_ABORT) /* SDO abort frame received */
                           {
                              ecx_SDOerror(context, Slave, Index, SubIndex, etohl(aSDOp->ldata[0]));
                           }
                           else
                           {
                              ecx_packeterror(context, Slave, Index, SubIndex, 1); /* Unexpected frame returned */
                           }
                           wkc = 0;
                           NotLast = FALSE;
                        }
                     }
                  }
                  toggle = toggle ^ 0x10; /* toggle bit for segment request */
               }
            }
            /* unexpected response from slave */
            else
            {
               if (aSDOp->Command == ECT_SDO_ABORT) /* SDO abort frame received */
               {
                  ecx_SDOerror(context, Slave, Index, SubIndex, etohl(aSDOp->ldata[0]));
               }
               else
               {
                  ecx_packeterror(context, Slave, Index, SubIndex, 1); /* Unexpected frame returned */
               }
               wkc = 0;
            }
         }
      }
   }

   return wkc;
}